

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O1

void __thiscall QMenuBar::mousePressEvent(QMenuBar *this,QMouseEvent *e)

{
  long lVar1;
  QMenuBarPrivate *this_00;
  long lVar2;
  Data *pDVar3;
  long lVar4;
  char cVar5;
  bool bVar6;
  ulong uVar7;
  QAction *action;
  QObject *pQVar8;
  uint uVar9;
  undefined4 uVar10;
  undefined8 in_RCX;
  long lVar11;
  ulong uVar12;
  long lVar13;
  QWidget *this_01;
  long in_FS_OFFSET;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  QPoint local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(e + 0x40) == 1) {
    this_00 = *(QMenuBarPrivate **)&(this->super_QWidget).field_0x8;
    this_00->field_0x298 = this_00->field_0x298 | 1;
    auVar17 = QEventPoint::position();
    auVar16._0_8_ =
         (double)((ulong)auVar17._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar17._8_8_;
    auVar16._8_8_ =
         (double)((ulong)auVar17._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar17._0_8_;
    auVar16 = minpd(_DAT_0066f5d0,auVar16);
    auVar17._8_8_ = -(ulong)(-2147483648.0 < auVar16._8_8_);
    auVar17._0_8_ = -(ulong)(-2147483648.0 < auVar16._0_8_);
    uVar9 = movmskpd((int)in_RCX,auVar17);
    lVar11 = CONCAT44((int)((ulong)in_RCX >> 0x20),uVar9);
    uVar12 = (ulong)(uint)(int)auVar16._8_8_;
    uVar7 = (ulong)(uint)(int)auVar16._0_8_ << 0x20;
    if ((uVar9 & 1) == 0) {
      uVar7 = 0x8000000000000000;
    }
    if ((uVar9 & 2) == 0) {
      uVar12 = 0x80000000;
    }
    action = QMenuBarPrivate::actionAt(this_00,(QPoint)(uVar12 | uVar7));
    if (action != (QAction *)0x0) {
      lVar2 = (this_00->hiddenActions).d.size;
      if (lVar2 == 0) {
LAB_0046e619:
        lVar11 = -1;
      }
      else {
        lVar13 = -8;
        do {
          lVar1 = lVar2 * -8 + lVar13;
          if (lVar1 == -8) goto LAB_0046e613;
          lVar11 = lVar13 + 8;
          lVar4 = lVar13 + 8;
          lVar13 = lVar11;
        } while (*(QAction **)((long)(this_00->hiddenActions).d.ptr + lVar4) != action);
        lVar11 = lVar11 >> 3;
LAB_0046e613:
        if (lVar1 == -8) goto LAB_0046e619;
      }
      if (lVar11 == -1) {
        cVar5 = QAction::isEnabled();
        if (cVar5 != '\0') {
          pDVar3 = (this_00->currentAction).wp.d;
          if ((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) {
            pQVar8 = (QObject *)0x0;
          }
          else {
            pQVar8 = (this_00->currentAction).wp.value;
          }
          if ((pQVar8 != (QObject *)action) || ((this_00->field_0x2a0 & 1) == 0)) {
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              QMenuBarPrivate::setCurrentAction(this_00,action,true,false);
              return;
            }
            goto LAB_0046e7d2;
          }
          pDVar3 = (this_00->activeMenu).wp.d;
          if ((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) {
            this_01 = (QWidget *)0x0;
          }
          else {
            this_01 = (QWidget *)(this_00->activeMenu).wp.value;
          }
          if (this_01 != (QWidget *)0x0) {
            (this_00->activeMenu).wp.d = (Data *)0x0;
            (this_00->activeMenu).wp.value = (QObject *)0x0;
            if (pDVar3 != (Data *)0x0) {
              LOCK();
              *(int *)pDVar3 = *(int *)pDVar3 + -1;
              UNLOCK();
              if (*(int *)pDVar3 == 0) {
                operator_delete(pDVar3);
              }
            }
            QWidget::setAttribute(this_01,WA_NoMouseReplay,true);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              QWidget::hide(this_01);
              return;
            }
            goto LAB_0046e7d2;
          }
          goto LAB_0046e6ed;
        }
      }
    }
    uVar10 = 0;
    QMenuBarPrivate::setCurrentAction(this_00,(QAction *)0x0,false,false);
    bVar6 = QWhatsThis::inWhatsThisMode();
    if (bVar6) {
      auVar16 = QEventPoint::globalPosition();
      auVar14._0_8_ =
           (double)((ulong)auVar16._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar16._8_8_;
      auVar14._8_8_ =
           (double)((ulong)auVar16._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar16._0_8_;
      auVar16 = minpd(_DAT_0066f5d0,auVar14);
      auVar15._8_8_ = -(ulong)(-2147483648.0 < auVar16._8_8_);
      auVar15._0_8_ = -(ulong)(-2147483648.0 < auVar16._0_8_);
      uVar9 = movmskpd(uVar10,auVar15);
      uVar7 = 0x8000000000000000;
      if ((uVar9 & 1) != 0) {
        uVar7 = (ulong)(uint)(int)auVar16._0_8_ << 0x20;
      }
      uVar12 = 0x80000000;
      if ((uVar9 & 2) != 0) {
        uVar12 = (ulong)(uint)(int)auVar16._8_8_;
      }
      local_40 = (QPoint)(uVar12 | uVar7);
      QWhatsThis::showText
                (&local_40,&(this_00->super_QWidgetPrivate).whatsThis,&this->super_QWidget);
    }
  }
LAB_0046e6ed:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0046e7d2:
  __stack_chk_fail();
}

Assistant:

void QMenuBar::mousePressEvent(QMouseEvent *e)
{
    Q_D(QMenuBar);
    if (e->button() != Qt::LeftButton)
        return;

    d->mouseDown = true;

    QAction *action = d->actionAt(e->position().toPoint());
    if (!action || !d->isVisible(action) || !action->isEnabled()) {
        d->setCurrentAction(nullptr);
#if QT_CONFIG(whatsthis)
        if (QWhatsThis::inWhatsThisMode())
            QWhatsThis::showText(e->globalPosition().toPoint(), d->whatsThis, this);
#endif
        return;
    }

    if (d->currentAction == action && d->popupState) {
        if (QMenu *menu = d->activeMenu) {
            d->activeMenu = nullptr;
            menu->setAttribute(Qt::WA_NoMouseReplay);
            menu->hide();
        }
    } else {
        d->setCurrentAction(action, true);
    }
}